

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::part_file::export_file
          (part_file *this,function<void_(long,_libtorrent::span<char>)> *f,int64_t offset,
          int64_t size,error_code *ec)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long *plVar4;
  pointer ppVar5;
  char *__p;
  pointer pcVar6;
  int64_t iVar7;
  error_code *in_R9;
  span<char> sVar8;
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  local_100;
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  local_f8;
  iterator j;
  span<char> local_c8;
  int local_b4;
  undefined1 auStack_b0 [4];
  int bytes_read;
  span<char> v;
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  _Stack_98;
  slot_index_t slot;
  long local_90;
  int local_84;
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  _Stack_80;
  int block_to_copy;
  iterator i;
  long lStack_70;
  file_handle file;
  int64_t file_offset;
  int64_t piece_offset;
  unique_ptr<char[],_std::default_delete<char[]>_> buf;
  piece_index_t end;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_48;
  undefined4 local_44;
  piece_index_t piece;
  unique_lock<std::mutex> l;
  error_code *ec_local;
  int64_t size_local;
  int64_t offset_local;
  function<void_(long,_libtorrent::span<char>)> *f_local;
  part_file *this_local;
  
  ec_local = (error_code *)size;
  size_local = offset;
  offset_local = (int64_t)f;
  f_local = (function<void_(long,_libtorrent::span<char>)> *)this;
  ::std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&piece,&this->m_mutex);
  bVar1 = ::std::
          unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
          ::empty(&this->m_piece_map);
  if (bVar1) {
    local_44 = 1;
  }
  else {
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
              (&local_48,(int)(size_local / (long)this->m_piece_size));
    strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
              ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&buf,
               (int)(((long)ec_local + (long)this->m_piece_size + -1 + size_local) /
                    (long)this->m_piece_size));
    ::std::unique_ptr<char[],std::default_delete<char[]>>::
    unique_ptr<std::default_delete<char[]>,void>
              ((unique_ptr<char[],std::default_delete<char[]>> *)&piece_offset);
    iVar7 = size_local;
    iVar2 = strong_typedef::operator_cast_to_int((strong_typedef *)&local_48);
    file_offset = iVar7 - (long)iVar2 * (long)this->m_piece_size;
    lStack_70 = 0;
    i.
    super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
    ._M_cur._0_4_ = 0;
    open_file((part_file *)
              ((long)&i.
                      super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                      ._M_cur + 4),(open_mode_t)(uint)this,(error_code *)0x0);
    bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
    if (bVar1) {
      local_44 = 1;
    }
    else {
      while (bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator<
                               (&local_48,
                                (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)&buf)
            , bVar1) {
        _Stack_80._M_cur =
             (__node_type *)
             ::std::
             unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
             ::find(&this->m_piece_map,&local_48);
        local_90 = this->m_piece_size - file_offset;
        plVar4 = ::std::min<long>(&local_90,(long *)&ec_local);
        local_84 = (int)*plVar4;
        _Stack_98._M_cur =
             (__node_type *)
             ::std::
             unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
             ::end(&this->m_piece_map);
        bVar1 = ::std::__detail::operator!=(&stack0xffffffffffffff80,&stack0xffffffffffffff68);
        if (bVar1) {
          ppVar5 = ::std::__detail::
                   _Node_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_false,_true>
                                 *)&stack0xffffffffffffff80);
          v.m_len._4_4_ = (ppVar5->second).m_val;
          bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&piece_offset);
          if (!bVar1) {
            __p = (char *)operator_new__((long)this->m_piece_size);
            ::std::unique_ptr<char[],std::default_delete<char[]>>::reset<char*,void>
                      ((unique_ptr<char[],std::default_delete<char[]>> *)&piece_offset,__p);
          }
          ::std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&piece);
          pcVar6 = ::std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                             ((unique_ptr<char[],_std::default_delete<char[]>_> *)&piece_offset);
          span<char>::span((span<char> *)auStack_b0,pcVar6,(long)local_84);
          uVar3 = file_handle::fd((file_handle *)
                                  ((long)&i.
                                          super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                                          ._M_cur + 4));
          span<char>::span<libtorrent::span<char>,char,void>(&local_c8,(span<char> *)auStack_b0);
          iVar7 = slot_offset(this,v.m_len._4_4_);
          sVar8.m_len = iVar7 + file_offset;
          sVar8.m_ptr = (char *)local_c8.m_len;
          local_b4 = pread_all((aux *)(ulong)uVar3,(handle_type)local_c8.m_ptr,sVar8,(int64_t)ec,
                               in_R9);
          sVar8 = span<char>::first((span<char> *)auStack_b0,(long)local_b4);
          v.m_ptr = (char *)sVar8.m_len;
          _auStack_b0 = sVar8.m_ptr;
          bVar1 = boost::system::error_code::operator_cast_to_bool(ec);
          if ((bVar1) || (bVar1 = span<char>::empty((span<char> *)auStack_b0), bVar1)) {
            local_44 = 1;
            goto LAB_004327f0;
          }
          pcVar6 = ::std::unique_ptr<char[],_std::default_delete<char[]>_>::get
                             ((unique_ptr<char[],_std::default_delete<char[]>_> *)&piece_offset);
          span<char>::span((span<char> *)&j,pcVar6,(long)local_84);
          ::std::function<void_(long,_libtorrent::span<char>)>::operator()(f,lStack_70,_j);
          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&piece);
          if (local_84 == this->m_piece_size) {
            local_f8._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
                 ::find(&this->m_piece_map,&local_48);
            local_100._M_cur =
                 (__node_type *)
                 ::std::
                 unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
                 ::end(&this->m_piece_map);
            bVar1 = ::std::__detail::operator!=(&local_f8,&local_100);
            if (bVar1) {
              ppVar5 = ::std::__detail::
                       _Node_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_false,_true>
                       ::operator->((_Node_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_false,_true>
                                     *)&local_f8);
              ::std::
              vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>
              ::push_back(&this->m_free_slots,&ppVar5->second);
              ::std::
              unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
              ::erase(&this->m_piece_map,(iterator)local_f8._M_cur);
              this->m_dirty_metadata = true;
            }
          }
        }
        lStack_70 = local_84 + lStack_70;
        file_offset = 0;
        ec_local = (error_code *)((long)ec_local - (long)local_84);
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++(&local_48);
      }
      local_44 = 0;
    }
LAB_004327f0:
    file_handle::~file_handle
              ((file_handle *)
               ((long)&i.
                       super__Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
                       ._M_cur + 4));
    ::std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
              ((unique_ptr<char[],_std::default_delete<char[]>_> *)&piece_offset);
  }
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&piece);
  return;
}

Assistant:

void part_file::export_file(std::function<void(std::int64_t, span<char>)> f
		, std::int64_t const offset, std::int64_t size, error_code& ec)
	{
		std::unique_lock<std::mutex> l(m_mutex);

		// there's nothing stored in the part_file. Nothing to do
		if (m_piece_map.empty()) return;

		piece_index_t piece(int(offset / m_piece_size));
		piece_index_t const end = piece_index_t(int(((offset + size) + m_piece_size - 1) / m_piece_size));

		std::unique_ptr<char[]> buf;

		std::int64_t piece_offset = offset - std::int64_t(static_cast<int>(piece))
			* m_piece_size;
		std::int64_t file_offset = 0;
		auto file = open_file(aux::open_mode::read_only, ec);
		if (ec) return;

		for (; piece < end; ++piece)
		{
			auto const i = m_piece_map.find(piece);
			int const block_to_copy = int(std::min(m_piece_size - piece_offset, size));
			if (i != m_piece_map.end())
			{
				slot_index_t const slot = i->second;

				if (!buf) buf.reset(new char[std::size_t(m_piece_size)]);

				// don't hold the lock during disk I/O
				l.unlock();

				span<char> v = {buf.get(), block_to_copy};
				auto bytes_read = aux::pread_all(file.fd(), v, slot_offset(slot) + piece_offset, ec);
				v = v.first(static_cast<std::ptrdiff_t>(bytes_read));
				TORRENT_ASSERT(!ec);
				if (ec || v.empty()) return;

				f(file_offset, {buf.get(), block_to_copy});

				// we're done with the disk I/O, grab the lock again to update
				// the slot map
				l.lock();

				if (block_to_copy == m_piece_size)
				{
					// since we released the lock, it's technically possible that
					// another thread removed this slot map entry, and invalidated
					// our iterator. Now that we hold the lock again, perform
					// another lookup to be sure.
					auto const j = m_piece_map.find(piece);
					if (j != m_piece_map.end())
					{
						// if the slot moved, that's really suspicious
						TORRENT_ASSERT(j->second == slot);
						m_free_slots.push_back(j->second);
						m_piece_map.erase(j);
						m_dirty_metadata = true;
					}
				}
			}
			file_offset += block_to_copy;
			piece_offset = 0;
			size -= block_to_copy;
		}
	}